

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdial.cpp
# Opt level: O0

void __thiscall QDial::mousePressEvent(QDial *this,QMouseEvent *e)

{
  uint uVar1;
  MouseButton MVar2;
  MouseButton __fd;
  Int IVar3;
  QDialPrivate *__addr;
  socklen_t *__addr_len;
  QDialPrivate *extraout_RDX;
  QDialPrivate *extraout_RDX_00;
  QSinglePointEvent *in_RSI;
  QSinglePointEvent *pQVar4;
  QSinglePointEvent *in_RDI;
  long in_FS_OFFSET;
  QPoint *in_stack_00000008;
  QDialPrivate *in_stack_00000010;
  QDialPrivate *d;
  undefined8 in_stack_ffffffffffffffa8;
  MouseButton other;
  undefined4 in_stack_ffffffffffffffbc;
  int position;
  QDialPrivate *this_00;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_c;
  long local_8;
  
  other = (MouseButton)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RSI;
  __addr = d_func((QDial *)0x56b2bf);
  __fd = (MouseButton)pQVar4;
  uVar1 = (__addr->super_QAbstractSliderPrivate).maximum;
  __addr_len = (socklen_t *)(ulong)uVar1;
  position = CONCAT13(1,(int3)in_stack_ffffffffffffffbc);
  this_00 = __addr;
  if (uVar1 != *(uint *)&(__addr->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254) {
    MVar2 = QSinglePointEvent::button(in_RSI);
    __addr_len = (socklen_t *)(ulong)MVar2;
    position = CONCAT13(1,(int3)position);
    __addr = extraout_RDX;
    if (MVar2 == LeftButton) {
      QSinglePointEvent::buttons(in_RDI);
      __fd = QSinglePointEvent::button(in_RSI);
      local_c.super_QFlagsStorage<Qt::MouseButton>.i =
           (QFlagsStorage<Qt::MouseButton>)
           QFlags<Qt::MouseButton>::operator^((QFlags<Qt::MouseButton> *)in_RDI,other);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
      position = CONCAT13(IVar3 != 0,(int3)position);
      __addr = extraout_RDX_00;
    }
  }
  if ((char)((uint)position >> 0x18) == '\0') {
    QEvent::accept((QEvent *)in_RSI,__fd,(sockaddr *)__addr,__addr_len);
    QSinglePointEvent::position((QSinglePointEvent *)0x56b368);
    QPointF::toPoint((QPointF *)this_00);
    QDialPrivate::valueFromPoint(in_stack_00000010,in_stack_00000008);
    QAbstractSlider::setSliderPosition((QAbstractSlider *)this_00,position);
    QAbstractSlider::setSliderDown((QAbstractSlider *)this_00,SUB41((uint)position >> 0x18,0));
  }
  else {
    QEvent::ignore((QEvent *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDial::mousePressEvent(QMouseEvent *e)
{
    Q_D(QDial);
    if (d->maximum == d->minimum ||
        (e->button() != Qt::LeftButton)  ||
        (e->buttons() ^ e->button())) {
        e->ignore();
        return;
    }
    e->accept();
    setSliderPosition(d->valueFromPoint(e->position().toPoint()));
    // ### This isn't quite right,
    // we should be doing a hit test and only setting this if it's
    // the actual dial thingie (similar to what QSlider does), but we have no
    // subControls for QDial.
    setSliderDown(true);
}